

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O1

void json_append_number(lua_State *l,json_config_t *cfg,strbuf_t *json,int lindex)

{
  int iVar1;
  int iVar2;
  lua_Number num;
  
  num = lua_tonumberx(l,lindex,(int *)0x0);
  if (cfg->encode_invalid_numbers == 1) {
    if (NAN(num)) {
      strbuf_append_mem(json,"NaN",3);
      return;
    }
    if (ABS(num) == INFINITY) {
      iVar2 = json->length;
      iVar1 = iVar2 - json->size;
      if (num < 0.0) {
        if (-10 < iVar1) {
          strbuf_resize(json,iVar2 + 9);
        }
        builtin_strncpy(json->buf + json->length,"-Infinity",9);
        json->length = json->length + 9;
        return;
      }
      if (-9 < iVar1) {
        strbuf_resize(json,iVar2 + 8);
      }
      builtin_strncpy(json->buf + json->length,"Infinity",8);
      json->length = json->length + 8;
      return;
    }
  }
  else if (cfg->encode_invalid_numbers == 0) {
    if (0x7fefffffffffffff < (ulong)ABS(num)) {
      json_encode_exception(l,cfg,json,lindex,"must not be NaN or Infinity");
    }
  }
  else if (0x7fefffffffffffff < (ulong)ABS(num)) {
    if (-5 < json->length - json->size) {
      strbuf_resize(json,json->length + 4);
    }
    builtin_strncpy(json->buf + json->length,"null",4);
    json->length = json->length + 4;
    return;
  }
  if (-0x21 < json->length - json->size) {
    strbuf_resize(json,json->length + 0x20);
  }
  iVar2 = fpconv_g_fmt(json->buf + json->length,num,cfg->encode_number_precision);
  json->length = json->length + iVar2;
  return;
}

Assistant:

static void json_append_number(lua_State *l, json_config_t *cfg,
                               strbuf_t *json, int lindex)
{
    double num = lua_tonumber(l, lindex);
    int len;

    if (cfg->encode_invalid_numbers == 0) {
        /* Prevent encoding invalid numbers */
        if (isinf(num) || isnan(num))
            json_encode_exception(l, cfg, json, lindex,
                                  "must not be NaN or Infinity");
    } else if (cfg->encode_invalid_numbers == 1) {
        /* Encode NaN/Infinity separately to ensure Javascript compatible
         * values are used. */
        if (isnan(num)) {
            strbuf_append_mem(json, "NaN", 3);
            return;
        }
        if (isinf(num)) {
            if (num < 0)
                strbuf_append_mem(json, "-Infinity", 9);
            else
                strbuf_append_mem(json, "Infinity", 8);
            return;
        }
    } else {
        /* Encode invalid numbers as "null" */
        if (isinf(num) || isnan(num)) {
            strbuf_append_mem(json, "null", 4);
            return;
        }
    }

    strbuf_ensure_empty_length(json, FPCONV_G_FMT_BUFSIZE);
    len = fpconv_g_fmt(strbuf_empty_ptr(json), num, cfg->encode_number_precision);
    strbuf_extend_length(json, len);
}